

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall mario::EventLoop::queueInLoop(EventLoop *this,Functor *cb)

{
  bool bVar1;
  MutexLockGuard local_20;
  MutexLockGuard lock;
  Functor *cb_local;
  EventLoop *this_local;
  
  lock._mutex = (MutexLock *)cb;
  MutexLockGuard::MutexLockGuard(&local_20,&this->_mutex);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
            (&this->_pendingFunctors,(value_type *)lock._mutex);
  MutexLockGuard::~MutexLockGuard(&local_20);
  bVar1 = isInLoopThread(this);
  if ((!bVar1) || ((this->_callingPendingFunctors & 1U) != 0)) {
    wakeup(this);
  }
  return;
}

Assistant:

void EventLoop::queueInLoop(const Functor& cb) {
    {
        MutexLockGuard lock(_mutex);
        _pendingFunctors.push_back(cb);
    }

    if (!isInLoopThread() || _callingPendingFunctors) {
        wakeup();
    }
}